

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O3

bool __thiscall CPubKey::Decompress(CPubKey *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t inputlen;
  long in_FS_OFFSET;
  bool bVar4;
  size_t publen;
  uchar pub [65];
  secp256k1_pubkey pubkey;
  size_t local_c0;
  uchar local_b8 [80];
  secp256k1_pubkey local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->vch[0];
  if ((bVar1 & 0xfe) == 2) {
    inputlen = 0x21;
  }
  else {
    bVar4 = false;
    if ((7 < bVar1) || (uVar2 = (uint)bVar1, (0xd0U >> (uVar2 & 0x1f) & 1) == 0)) goto LAB_0041d4bb;
    if ((7 < uVar2) || (inputlen = 0x41, (0xd0U >> (uVar2 & 0x1f) & 1) == 0)) {
      inputlen = 0;
    }
  }
  iVar3 = secp256k1_ec_pubkey_parse(secp256k1_context_static,&local_68,this->vch,inputlen);
  bVar4 = iVar3 != 0;
  if (bVar4) {
    local_c0 = 0x41;
    secp256k1_ec_pubkey_serialize(secp256k1_context_static,local_b8,&local_c0,&local_68,2);
    Set<unsigned_char*>(this,local_b8,local_b8 + local_c0);
  }
LAB_0041d4bb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CPubKey::Decompress() {
    if (!IsValid())
        return false;
    secp256k1_pubkey pubkey;
    if (!secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size())) {
        return false;
    }
    unsigned char pub[SIZE];
    size_t publen = SIZE;
    secp256k1_ec_pubkey_serialize(secp256k1_context_static, pub, &publen, &pubkey, SECP256K1_EC_UNCOMPRESSED);
    Set(pub, pub + publen);
    return true;
}